

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O3

void produce<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                *s)

{
  int iVar1;
  pointer pAVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  lVar8 = RING_BUFFER_SIZE * counter;
  if (0 < lVar8) {
    lVar6 = 0;
    do {
      uVar4 = disruptor::MultiThreadedStrategyEx::IncrementAndGet
                        (&s->claim_strategy_,&s->cursor_,&s->gating_sequences_,delta);
      auVar3 = _DAT_00129040;
      uVar5 = uVar4 - delta;
      if (uVar4 < delta) {
        if (-1 < (long)uVar4) {
          uVar5 = (ulong)(s->ring_buffer_).index_mask_;
          pAVar2 = (s->ring_buffer_).events_.
                   super__Vector_base<disruptor::RingBuffer<long,_64>::AlignedElement,_std::allocator<disruptor::RingBuffer<long,_64>::AlignedElement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          auVar9._8_4_ = (int)uVar4;
          auVar9._0_8_ = uVar4;
          auVar9._12_4_ = (int)(uVar4 >> 0x20);
          auVar9 = auVar9 ^ _DAT_00129040;
          uVar7 = 0;
          auVar10 = _DAT_00129030;
          do {
            auVar12 = auVar10 ^ auVar3;
            if ((bool)(~(auVar9._4_4_ < auVar12._4_4_ ||
                        auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar9._4_4_) & 1)) {
              pAVar2[uVar7 & uVar5].elem_ = uVar7;
            }
            if (auVar12._12_4_ <= auVar9._12_4_ &&
                (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
              pAVar2[uVar7 + 1 & uVar5].elem_ = uVar7 + 1;
            }
            uVar7 = uVar7 + 2;
            lVar11 = auVar10._8_8_;
            auVar10._0_8_ = auVar10._0_8_ + 2;
            auVar10._8_8_ = lVar11 + 2;
          } while ((uVar4 & 0x7ffffffffffffffe) + 2 != uVar7);
        }
        uVar5 = uVar4 - delta;
        while (uVar5 = uVar5 + 1, (long)uVar5 <= (long)uVar4) {
          (s->claim_strategy_).available_buffer_.
          super__Vector_base<std::atomic<int>,_std::allocator<std::atomic<int>_>_>._M_impl.
          super__Vector_impl_data._M_start[(long)(s->claim_strategy_).index_mask_ & uVar5].
          super___atomic_base<int>._M_i =
               (__int_type_conflict1)
               ((long)uVar5 >> ((byte)(s->claim_strategy_).index_shift_ & 0x3f));
        }
      }
      else {
        if (uVar5 < uVar4) {
          iVar1 = (s->ring_buffer_).index_mask_;
          pAVar2 = (s->ring_buffer_).events_.
                   super__Vector_base<disruptor::RingBuffer<long,_64>::AlignedElement,_std::allocator<disruptor::RingBuffer<long,_64>::AlignedElement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = uVar4;
          do {
            pAVar2[uVar7 & (long)iVar1].elem_ = uVar7;
            uVar7 = uVar7 - 1;
            uVar5 = uVar4 - delta;
          } while (uVar5 < uVar7);
        }
        while (uVar5 = uVar5 + 1, (long)uVar5 <= (long)uVar4) {
          (s->claim_strategy_).available_buffer_.
          super__Vector_base<std::atomic<int>,_std::allocator<std::atomic<int>_>_>._M_impl.
          super__Vector_impl_data._M_start[(long)(s->claim_strategy_).index_mask_ & uVar5].
          super___atomic_base<int>._M_i =
               (__int_type_conflict1)
               ((long)uVar5 >> ((byte)(s->claim_strategy_).index_shift_ & 0x3f));
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar8);
  }
  return;
}

Assistant:

void produce(disruptor::Sequencer<T, C, W, Alignment>& s) {
  int64_t iterations = counter * RING_BUFFER_SIZE;

  for (int64_t i = 0; i < iterations; ++i) {
    int64_t sequence = s.Claim(delta);

    if (sequence < delta) {
      for (int64_t k = 0; k <= sequence; ++k) {
        s[k] = k;
#ifdef PRINT_DEBUG_PROD
        std::stringstream ss;
        ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id()
           << '\n';
        std::cout << ss.str();
#endif
      }

      s.Publish(sequence, delta);
      continue;
    }

    for (int64_t k = sequence; k > sequence - delta; --k) {
      s[k] = k;

#ifdef PRINT_DEBUG_PROD
      std::stringstream ss;
      ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
    }

    s.Publish(sequence, delta);
  }
}